

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LICMPass::IsImmediatelyContainedInLoop
          (LICMPass *this,Loop *loop,Function *f,BasicBlock *bb)

{
  uint32_t block_id;
  IRContext *this_00;
  LoopDescriptor *this_01;
  Loop *pLVar1;
  LoopDescriptor *loop_descriptor;
  BasicBlock *bb_local;
  Function *f_local;
  Loop *loop_local;
  LICMPass *this_local;
  
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::GetLoopDescriptor(this_00,f);
  block_id = BasicBlock::id(bb);
  pLVar1 = LoopDescriptor::operator[](this_01,block_id);
  return loop == pLVar1;
}

Assistant:

bool LICMPass::IsImmediatelyContainedInLoop(Loop* loop, Function* f,
                                            BasicBlock* bb) {
  LoopDescriptor* loop_descriptor = context()->GetLoopDescriptor(f);
  return loop == (*loop_descriptor)[bb->id()];
}